

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

int __thiscall ImGuiStorage::GetInt(ImGuiStorage *this,ImGuiID key,int default_val)

{
  Pair *pPVar1;
  Pair *pPVar2;
  ulong uVar3;
  ulong uVar5;
  ulong uVar6;
  ulong uVar4;
  
  uVar6 = (ulong)(this->Data).Size;
  pPVar1 = (this->Data).Data;
  pPVar2 = pPVar1;
  uVar4 = uVar6;
  if (uVar6 == 0) {
    uVar6 = 0;
  }
  else {
    do {
      uVar3 = uVar4 >> 1;
      uVar5 = uVar3;
      if (pPVar2[uVar3].key < key) {
        uVar5 = ~uVar3 + uVar4;
        pPVar2 = pPVar2 + uVar3 + 1;
      }
      uVar4 = uVar5;
    } while (uVar5 != 0);
  }
  if ((pPVar2 != pPVar1 + uVar6) && (pPVar2->key == key)) {
    default_val = (pPVar2->field_1).val_i;
  }
  return default_val;
}

Assistant:

int ImGuiStorage::GetInt(ImGuiID key, int default_val) const
{
    ImVector<Pair>::iterator it = LowerBound(const_cast<ImVector<ImGuiStorage::Pair>&>(Data), key);
    if (it == Data.end() || it->key != key)
        return default_val;
    return it->val_i;
}